

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ts_parser__recover(TSParser *self,StackVersion version,Subtree lookahead)

{
  SubtreePool *pSVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  StackSummaryEntry *pSVar4;
  SubtreeHeapData *pSVar5;
  _Bool _Var6;
  TSStateId TVar7;
  ushort uVar8;
  TSSymbol TVar9;
  uint uVar10;
  uint uVar11;
  uint32_t count;
  StackSummary *pSVar12;
  undefined4 extraout_var;
  Subtree *pSVar13;
  Subtree SVar14;
  TSParseAction *pTVar15;
  MutableSubtree subtree;
  StackSlice *pSVar16;
  uint uVar17;
  char *pcVar18;
  ulong uVar19;
  byte bVar20;
  byte bVar22;
  uint j;
  StackVersion SVar21;
  uint uVar23;
  ulong uVar24;
  Stack *pSVar25;
  uint j_1;
  StackSlice *self_00;
  StackVersion version_00;
  uint32_t version_01;
  StackSliceArray SVar26;
  Length LVar27;
  Length LVar28;
  SubtreeArray children;
  uint n;
  uint local_80;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  StackSummary *local_60;
  ulong local_58;
  SubtreeArray local_50;
  SubtreeArray error_trees;
  
  version_01 = (self->stack->heads).size;
  LVar27 = ts_stack_position(self->stack,version);
  pSVar12 = ts_stack_get_summary(self->stack,version);
  uVar10 = ts_stack_node_count_since_error(self->stack,version);
  uVar11 = ts_stack_error_cost(self->stack,version);
  local_78 = CONCAT44(extraout_var,uVar11);
  bVar22 = lookahead.data.symbol;
  if ((pSVar12 != (StackSummary *)0x0) &&
     ((((ulong)lookahead.ptr & 1) != 0 || ((lookahead.ptr)->symbol != 0xffff)))) {
    local_68 = (ulong)(uVar10 != 0);
    local_70 = LVar27._0_8_ >> 0x20;
    pSVar1 = &self->tree_pool;
    uVar19 = 0;
    local_60 = pSVar12;
    while (uVar19 < local_60->size) {
      pSVar4 = local_60->contents;
      uVar8 = pSVar4[uVar19].state;
      local_58 = uVar19;
      if ((uVar8 != 0) && (uVar2 = pSVar4[uVar19].position.bytes, uVar2 != LVar27.bytes)) {
        uVar3 = pSVar4[uVar19].position.extent.row;
        uVar23 = pSVar4[uVar19].depth;
        count = (int)local_68 + uVar23;
        for (SVar21 = 0; version_01 != SVar21; SVar21 = SVar21 + 1) {
          TVar7 = ts_stack_state(self->stack,SVar21);
          if ((TVar7 == uVar8) &&
             (LVar28 = ts_stack_position(self->stack,SVar21), LVar28.bytes == LVar27.bytes))
          goto LAB_0011cdbd;
        }
        uVar17 = ((int)local_70 - uVar3) * 0x1e;
        _Var6 = ts_parser__better_version_exists
                          (self,version,
                           (_Bool)((((char)uVar11 + (char)LVar27.bytes) - (char)uVar2) +
                                   (char)uVar23 * 'd' + (char)uVar17),uVar17);
        if (_Var6) {
          bVar20 = 0;
          goto LAB_0011ce94;
        }
        TVar9 = (TSSymbol)bVar22;
        if (((ulong)lookahead.ptr & 1) == 0) {
          TVar9 = (lookahead.ptr)->symbol;
        }
        _Var6 = ts_language_has_actions(self->language,uVar8,TVar9);
        if (_Var6) {
          _n = ts_stack_pop_count(self->stack,version,count);
          uVar23 = 0;
          SVar21 = 0xffffffff;
          uVar19 = n._8_8_;
          while (uVar23 < (uint)uVar19) {
            pSVar16 = _n + uVar23;
            children.contents = (pSVar16->subtrees).contents;
            children.size = (pSVar16->subtrees).size;
            children.capacity = (pSVar16->subtrees).capacity;
            version_00 = (StackVersion)*(undefined8 *)&_n[uVar23].version;
            if (version_00 == SVar21) {
              ts_subtree_array_delete(pSVar1,&children);
LAB_0011ccea:
              array__erase((VoidArray *)&n,0x18,uVar23);
            }
            else {
              TVar7 = ts_stack_state(self->stack,version_00);
              if (TVar7 != uVar8) {
                ts_stack_halt(self->stack,version_00);
                ts_subtree_array_delete(pSVar1,&children);
                goto LAB_0011ccea;
              }
              error_trees = ts_stack_pop_error(self->stack,version_00);
              if (error_trees.size != 0) {
                if (error_trees.size != 1) {
                  __assert_fail("error_trees.size == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                                ,0x40e,
                                "_Bool ts_parser__recover_to_state(TSParser *, StackVersion, unsigned int, TSStateId)"
                               );
                }
                pSVar5 = (error_trees.contents)->ptr;
                if (((ulong)pSVar5 & 1) == 0) {
                  uVar17 = pSVar5->child_count;
                  if ((ulong)uVar17 != 0) {
                    array__splice((VoidArray *)&children,8,0,0,uVar17,
                                  (pSVar5->field_17).field_0.children);
                    pSVar13 = children.contents;
                    for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
                      ts_subtree_retain(pSVar13[uVar19]);
                    }
                  }
                }
                ts_subtree_array_delete(pSVar1,&error_trees);
              }
              local_50 = ts_subtree_array_remove_trailing_extras(&children);
              uVar19 = local_50._8_8_;
              pSVar13 = local_50.contents;
              if (children.size == 0) {
                array__delete((VoidArray *)&children);
              }
              else {
                SVar14 = ts_subtree_new_error_node(pSVar1,&children,true,self->language);
                ts_stack_push(self->stack,version_00,SVar14,false,uVar8);
              }
              for (uVar24 = 0; (uVar19 & 0xffffffff) != uVar24; uVar24 = uVar24 + 1) {
                ts_stack_push(self->stack,version_00,pSVar13[uVar24],false,uVar8);
              }
              array__delete((VoidArray *)&local_50);
              uVar23 = uVar23 + 1;
              SVar21 = version_00;
            }
            uVar19 = (ulong)local_80;
          }
          if (SVar21 != 0xffffffff) {
            if (((self->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0) &&
               (self->dot_graph_file == (FILE *)0x0)) {
              bVar20 = 1;
            }
            else {
              snprintf((self->lexer).debug_buffer,0x400,"recover_to_previous state:%u, depth:%u",
                       (ulong)uVar8,(ulong)count);
              ts_parser__log(self);
              bVar20 = 1;
              if (self->dot_graph_file != (FILE *)0x0) {
                ts_stack_print_dot_graph(self->stack,self->language,self->dot_graph_file);
                fputs("\n\n",(FILE *)self->dot_graph_file);
              }
            }
            goto LAB_0011ce94;
          }
        }
      }
LAB_0011cdbd:
      uVar19 = local_58 + 1;
    }
  }
  bVar20 = 0;
LAB_0011ce94:
  while( true ) {
    pSVar25 = self->stack;
    uVar11 = (pSVar25->heads).size;
    if (uVar11 <= version_01) break;
    _Var6 = ts_stack_is_active(pSVar25,version_01);
    SVar21 = version_01;
    if (!_Var6) {
      SVar21 = version_01 - 1;
      ts_stack_remove_version(self->stack,version_01);
    }
    version_01 = SVar21 + 1;
  }
  if (!(bool)(bVar20 & 6 < uVar11)) {
    if (((ulong)lookahead.ptr & 1) == 0) {
      uVar8 = (lookahead.ptr)->symbol;
    }
    else {
      uVar8 = (ushort)bVar22;
    }
    if (uVar8 == 0) {
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        builtin_strncpy((self->lexer).debug_buffer,"recover_eof",0xc);
        ts_parser__log(self);
      }
      children.contents = (Subtree *)0x0;
      children.size = 0;
      children.capacity = 0;
      SVar14 = ts_subtree_new_error_node(&self->tree_pool,&children,false,self->language);
      ts_stack_push(self->stack,version,SVar14,false,1);
      ts_parser__accept(self,version,lookahead);
    }
    else {
      LVar27 = ts_subtree_total_size(lookahead);
      uVar11 = (int)local_78 + LVar27.bytes;
      _Var6 = ts_parser__better_version_exists
                        (self,version,(_Bool)((char)LVar27.extent.row * '\x1e' + (char)uVar11 + 'd')
                         ,uVar11);
      if (_Var6) {
        ts_stack_halt(self->stack,version);
        goto LAB_0011cf2c;
      }
      if (((ulong)lookahead.ptr & 1) == 0) {
        TVar9 = (lookahead.ptr)->symbol;
      }
      else {
        TVar9 = (TSSymbol)bVar22;
      }
      pTVar15 = ts_language_actions(self->language,1,TVar9,&n);
      if (((n != 0) && ((pTVar15[n - 1].field_0x6 & 0xf) == 0)) &&
         (((uint6)pTVar15[n - 1].params & 0x10000) != 0)) {
        lookahead = (Subtree)ts_subtree_make_mut(&self->tree_pool,lookahead);
        if (((ulong)lookahead.ptr & 1) == 0) {
          (lookahead.ptr)->field_0x2c = (lookahead.ptr)->field_0x2c | 4;
        }
        else {
          lookahead.ptr = (SubtreeHeapData *)((ulong)lookahead.ptr | 8);
        }
      }
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        if (((ulong)lookahead.ptr & 1) == 0) {
          uVar8 = (lookahead.ptr)->symbol;
        }
        else {
          uVar8 = (ushort)lookahead.data.symbol;
        }
        if (uVar8 == 0xffff) {
          pcVar18 = "ERROR";
        }
        else if (uVar8 == 0xfffe) {
          pcVar18 = "_ERROR";
        }
        else {
          pcVar18 = self->language->symbol_names[uVar8];
        }
        snprintf((self->lexer).debug_buffer,0x400,"skip_token symbol:%s",pcVar18);
        ts_parser__log(self);
      }
      children.contents = (Subtree *)0x0;
      children.size = 0;
      children.capacity = 0;
      array__reserve((VoidArray *)&children,8,1);
      array__grow((VoidArray *)&children,8);
      uVar19 = children._8_8_ & 0xffffffff;
      children.size = children.size + 1;
      children.contents[uVar19] = lookahead;
      pSVar1 = &self->tree_pool;
      subtree = ts_subtree_new_node(pSVar1,0xfffe,&children,0,self->language);
      if (uVar10 != 0) {
        SVar26 = ts_stack_pop_count(self->stack,version,1);
        pSVar16 = SVar26.contents;
        if (((undefined1  [16])SVar26 & (undefined1  [16])0xfffffffe) == (undefined1  [16])0x0) {
          pSVar25 = self->stack;
          SVar21 = pSVar16->version;
        }
        else {
          uVar19 = (ulong)SVar26.size;
          self_00 = pSVar16;
          while( true ) {
            uVar19 = uVar19 - 1;
            self_00 = self_00 + 1;
            if (uVar19 == 0) break;
            ts_subtree_array_delete(pSVar1,&self_00->subtrees);
          }
          while( true ) {
            pSVar25 = self->stack;
            SVar21 = pSVar16->version;
            if ((pSVar25->heads).size <= SVar21 + 1) break;
            ts_stack_remove_version(pSVar25,SVar21 + 1);
          }
        }
        ts_stack_renumber_version(pSVar25,SVar21,version);
        array__grow((VoidArray *)pSVar16,8);
        uVar10 = (pSVar16->subtrees).size;
        (pSVar16->subtrees).size = uVar10 + 1;
        *(MutableSubtree *)((pSVar16->subtrees).contents + uVar10) = subtree;
        subtree = ts_subtree_new_node(pSVar1,0xfffe,&pSVar16->subtrees,0,self->language);
      }
      ts_stack_push(self->stack,version,(Subtree)subtree,false,0);
      if ((((ulong)lookahead.ptr & 1) == 0) && (((lookahead.ptr)->field_0x2c & 0x40) != 0)) {
        pSVar25 = self->stack;
        SVar14 = ts_subtree_last_external_token(lookahead);
        ts_stack_set_last_external_token(pSVar25,version,SVar14);
      }
    }
    return;
  }
  ts_stack_halt(pSVar25,version);
LAB_0011cf2c:
  ts_subtree_release(&self->tree_pool,lookahead);
  return;
}

Assistant:

static void ts_parser__recover(TSParser *self, StackVersion version, Subtree lookahead) {
  bool did_recover = false;
  unsigned previous_version_count = ts_stack_version_count(self->stack);
  Length position = ts_stack_position(self->stack, version);
  StackSummary *summary = ts_stack_get_summary(self->stack, version);
  unsigned node_count_since_error = ts_stack_node_count_since_error(self->stack, version);
  unsigned current_error_cost = ts_stack_error_cost(self->stack, version);

  // When the parser is in the error state, there are two strategies for recovering with a
  // given lookahead token:
  // 1. Find a previous state on the stack in which that lookahead token would be valid. Then,
  //    create a new stack version that is in that state again. This entails popping all of the
  //    subtrees that have been pushed onto the stack since that previous state, and wrapping
  //    them in an ERROR node.
  // 2. Wrap the lookahead token in an ERROR node, push that ERROR node onto the stack, and
  //    move on to the next lookahead token, remaining in the error state.
  //
  // First, try the strategy 1. Upon entering the error state, the parser recorded a summary
  // of the previous parse states and their depths. Look at each state in the summary, to see
  // if the current lookahead token would be valid in that state.
  if (summary && !ts_subtree_is_error(lookahead)) {
    for (unsigned i = 0; i < summary->size; i++) {
      StackSummaryEntry entry = summary->contents[i];

      if (entry.state == ERROR_STATE) continue;
      if (entry.position.bytes == position.bytes) continue;
      unsigned depth = entry.depth;
      if (node_count_since_error > 0) depth++;

      // Do not recover in ways that create redundant stack versions.
      bool would_merge = false;
      for (unsigned j = 0; j < previous_version_count; j++) {
        if (
          ts_stack_state(self->stack, j) == entry.state &&
          ts_stack_position(self->stack, j).bytes == position.bytes
        ) {
          would_merge = true;
          break;
        }
      }
      if (would_merge) continue;

      // Do not recover if the result would clearly be worse than some existing stack version.
      unsigned new_cost =
        current_error_cost +
        entry.depth * ERROR_COST_PER_SKIPPED_TREE +
        (position.bytes - entry.position.bytes) * ERROR_COST_PER_SKIPPED_CHAR +
        (position.extent.row - entry.position.extent.row) * ERROR_COST_PER_SKIPPED_LINE;
      if (ts_parser__better_version_exists(self, version, false, new_cost)) break;

      // If the current lookahead token is valid in some previous state, recover to that state.
      // Then stop looking for further recoveries.
      if (ts_language_has_actions(self->language, entry.state, ts_subtree_symbol(lookahead))) {
        if (ts_parser__recover_to_state(self, version, depth, entry.state)) {
          did_recover = true;
          LOG("recover_to_previous state:%u, depth:%u", entry.state, depth);
          LOG_STACK();
          break;
        }
      }
    }
  }

  // In the process of attemping to recover, some stack versions may have been created
  // and subsequently halted. Remove those versions.
  for (unsigned i = previous_version_count; i < ts_stack_version_count(self->stack); i++) {
    if (!ts_stack_is_active(self->stack, i)) {
      ts_stack_remove_version(self->stack, i--);
    }
  }

  // If strategy 1 succeeded, a new stack version will have been created which is able to handle
  // the current lookahead token. Now, in addition, try strategy 2 described above: skip the
  // current lookahead token by wrapping it in an ERROR node.

  // Don't pursue this additional strategy if there are already too many stack versions.
  if (did_recover && ts_stack_version_count(self->stack) > MAX_VERSION_COUNT) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the parser is still in the error state at the end of the file, just wrap everything
  // in an ERROR node and terminate.
  if (ts_subtree_is_eof(lookahead)) {
    LOG("recover_eof");
    SubtreeArray children = array_new();
    Subtree parent = ts_subtree_new_error_node(&self->tree_pool, &children, false, self->language);
    ts_stack_push(self->stack, version, parent, false, 1);
    ts_parser__accept(self, version, lookahead);
    return;
  }

  // Do not recover if the result would clearly be worse than some existing stack version.
  unsigned new_cost =
    current_error_cost + ERROR_COST_PER_SKIPPED_TREE +
    ts_subtree_total_bytes(lookahead) * ERROR_COST_PER_SKIPPED_CHAR +
    ts_subtree_total_size(lookahead).extent.row * ERROR_COST_PER_SKIPPED_LINE;
  if (ts_parser__better_version_exists(self, version, false, new_cost)) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the current lookahead token is an extra token, mark it as extra. This means it won't
  // be counted in error cost calculations.
  unsigned n;
  const TSParseAction *actions = ts_language_actions(self->language, 1, ts_subtree_symbol(lookahead), &n);
  if (n > 0 && actions[n - 1].type == TSParseActionTypeShift && actions[n - 1].params.extra) {
    MutableSubtree mutable_lookahead = ts_subtree_make_mut(&self->tree_pool, lookahead);
    ts_subtree_set_extra(&mutable_lookahead);
    lookahead = ts_subtree_from_mut(mutable_lookahead);
  }

  // Wrap the lookahead token in an ERROR.
  LOG("skip_token symbol:%s", TREE_NAME(lookahead));
  SubtreeArray children = array_new();
  array_reserve(&children, 1);
  array_push(&children, lookahead);
  MutableSubtree error_repeat = ts_subtree_new_node(
    &self->tree_pool,
    ts_builtin_sym_error_repeat,
    &children,
    0,
    self->language
  );

  // If other tokens have already been skipped, so there is already an ERROR at the top of the
  // stack, then pop that ERROR off the stack and wrap the two ERRORs together into one larger
  // ERROR.
  if (node_count_since_error > 0) {
    StackSliceArray pop = ts_stack_pop_count(self->stack, version, 1);

    // TODO: Figure out how to make this condition occur.
    // See https://github.com/atom/atom/issues/18450#issuecomment-439579778
    // If multiple stack versions have merged at this point, just pick one of the errors
    // arbitrarily and discard the rest.
    if (pop.size > 1) {
      for (unsigned i = 1; i < pop.size; i++) {
        ts_subtree_array_delete(&self->tree_pool, &pop.contents[i].subtrees);
      }
      while (ts_stack_version_count(self->stack) > pop.contents[0].version + 1) {
        ts_stack_remove_version(self->stack, pop.contents[0].version + 1);
      }
    }

    ts_stack_renumber_version(self->stack, pop.contents[0].version, version);
    array_push(&pop.contents[0].subtrees, ts_subtree_from_mut(error_repeat));
    error_repeat = ts_subtree_new_node(
      &self->tree_pool,
      ts_builtin_sym_error_repeat,
      &pop.contents[0].subtrees,
      0,
      self->language
    );
  }

  // Push the new ERROR onto the stack.
  ts_stack_push(self->stack, version, ts_subtree_from_mut(error_repeat), false, ERROR_STATE);
  if (ts_subtree_has_external_tokens(lookahead)) {
    ts_stack_set_last_external_token(
      self->stack, version, ts_subtree_last_external_token(lookahead)
    );
  }
}